

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::insert_frame(QTextDocumentPrivate *this,QTextFrame *f)

{
  QTextFrame *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  QTextFrame *pQVar4;
  QPodArrayOps<QTextFrame*> *this_01;
  long lVar5;
  ulong i;
  ulong uVar6;
  long in_FS_OFFSET;
  QTextFrame *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QTextFrame::firstPosition(f);
  iVar2 = QTextFrame::lastPosition(f);
  pQVar4 = frameAt(this,iVar1 + -1);
  lVar5 = *(long *)&(pQVar4->super_QTextObject).field_0x8;
  uVar6 = *(ulong *)(lVar5 + 0xa8);
  if (iVar1 == iVar2) {
LAB_004d4689:
    if (uVar6 != 0) {
      uVar6 = 0;
      do {
        iVar1 = QTextFrame::firstPosition(*(QTextFrame **)(*(long *)(lVar5 + 0xa0) + uVar6 * 8));
        lVar5 = *(long *)&(pQVar4->super_QTextObject).field_0x8;
        if (iVar2 < iVar1) break;
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(ulong *)(lVar5 + 0xa8));
      goto LAB_004d46bc;
    }
  }
  else if (uVar6 != 0) {
    i = 0;
    do {
      this_00 = *(QTextFrame **)(*(long *)(lVar5 + 0xa0) + i * 8);
      iVar3 = QTextFrame::firstPosition(this_00);
      if ((iVar1 < iVar3) && (iVar3 = QTextFrame::lastPosition(this_00), iVar3 < iVar2)) {
        QList<QTextFrame_*>::removeAt
                  ((QList<QTextFrame_*> *)(*(long *)&(pQVar4->super_QTextObject).field_0x8 + 0x98),i
                  );
        lVar5 = *(long *)&(f->super_QTextObject).field_0x8;
        this_01 = (QPodArrayOps<QTextFrame*> *)(lVar5 + 0x98);
        local_40 = this_00;
        QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
                  (this_01,*(qsizetype *)(lVar5 + 0xa8),&local_40);
        QList<QTextFrame_*>::end((QList<QTextFrame_*> *)this_01);
        *(QTextFrame **)(*(long *)&(this_00->super_QTextObject).field_0x8 + 0x90) = f;
      }
      i = i + 1;
      lVar5 = *(long *)&(pQVar4->super_QTextObject).field_0x8;
      uVar6 = *(ulong *)(lVar5 + 0xa8);
    } while (i < uVar6);
    goto LAB_004d4689;
  }
  uVar6 = 0;
LAB_004d46bc:
  local_40 = f;
  QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
            ((QPodArrayOps<QTextFrame*> *)(lVar5 + 0x98),uVar6,&local_40);
  QList<QTextFrame_*>::begin((QList<QTextFrame_*> *)(lVar5 + 0x98));
  *(QTextFrame **)(*(long *)&(f->super_QTextObject).field_0x8 + 0x90) = pQVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::insert_frame(QTextFrame *f)
{
    int start = f->firstPosition();
    int end = f->lastPosition();
    QTextFrame *parent = frameAt(start-1);
    Q_ASSERT(parent == frameAt(end+1));

    if (start != end) {
        // iterator over the parent and move all children contained in my frame to myself
        for (int i = 0; i < parent->d_func()->childFrames.size(); ++i) {
            QTextFrame *c = parent->d_func()->childFrames.at(i);
            if (start < c->firstPosition() && end > c->lastPosition()) {
                parent->d_func()->childFrames.removeAt(i);
                f->d_func()->childFrames.append(c);
                c->d_func()->parentFrame = f;
            }
        }
    }
    // insert at the correct position
    int i = 0;
    for (; i < parent->d_func()->childFrames.size(); ++i) {
        QTextFrame *c = parent->d_func()->childFrames.at(i);
        if (c->firstPosition() > end)
            break;
    }
    parent->d_func()->childFrames.insert(i, f);
    f->d_func()->parentFrame = parent;
}